

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_util.cpp
# Opt level: O3

void __thiscall
TaprootUtil_CreateTapScriptControl_Elements_Sign_Test::
~TaprootUtil_CreateTapScriptControl_Elements_Sign_Test
          (TaprootUtil_CreateTapScriptControl_Elements_Sign_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TaprootUtil, CreateTapScriptControl_Elements_Sign) {
  Privkey key = Privkey::FromWif(
    "cQRxS6BoPsuT8nyHMCYAKsRVDSnLisMxw4gUTeMURKioMMxTMSPE");
  Pubkey pubkey = key.GeneratePubkey();
  bool is_parity = false;
  SchnorrPubkey schnorr_pubkey = SchnorrPubkey::FromPubkey(pubkey, &is_parity);
  EXPECT_EQ("91d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0e",
      schnorr_pubkey.GetHex());
  EXPECT_TRUE(is_parity);

  Script redeem_script = (ScriptBuilder() << schnorr_pubkey.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();
  std::vector<ByteData256> nodes;
  NetType net_type = NetType::kElementsRegtest;
  TaprootScriptTree tree(redeem_script, net_type);
  EXPECT_EQ("tl(2091d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0eac)", tree.ToString());
  EXPECT_EQ("28acef70865e49908679b8dd6c3751f82dc4099b1d3d37affa685e928adc43f0", tree.GetTapLeafHash().GetHex());
  EXPECT_EQ("28acef70865e49908679b8dd6c3751f82dc4099b1d3d37affa685e928adc43f0", tree.GetCurrentBranchHash().GetHex());
  EXPECT_EQ("bde9b8f2c003300925e314249fea0daade214bbd4ce68c46f8989efc98544495", tree.GetTweakedPubkey(schnorr_pubkey).GetHex());
  Script locking_script;
  SchnorrPubkey pk0;
  auto taproot_control = TaprootUtil::CreateTapScriptControl(
      schnorr_pubkey, tree, &pk0, &locking_script);
  EXPECT_EQ("bde9b8f2c003300925e314249fea0daade214bbd4ce68c46f8989efc98544495", pk0.GetHex());
  Address addr01(net_type, WitnessVersion::kVersion1, pk0, GetElementsAddressFormatList());
  EXPECT_EQ("ert1phh5m3ukqqvcqjf0rzsjfl6sd4t0zzjaafnngc3hcnz00exz5gj2s8a8rjz", addr01.GetAddress());
  EXPECT_EQ(locking_script.GetHex(), addr01.GetLockingScript().GetHex());
  EXPECT_EQ("5120bde9b8f2c003300925e314249fea0daade214bbd4ce68c46f8989efc98544495", addr01.GetLockingScript().GetHex());
  EXPECT_TRUE(tree.HasTapLeaf());
  EXPECT_TRUE(tree.IsElements());

  auto desc = Descriptor::ParseElements("tr(91d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0e,pk(91d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0e))");
  auto ref = desc.GetReference();
  auto addr = ref.GenerateAddress(NetType::kElementsRegtest);
  EXPECT_EQ("ert1phh5m3ukqqvcqjf0rzsjfl6sd4t0zzjaafnngc3hcnz00exz5gj2s8a8rjz", addr.GetAddress());
  EXPECT_EQ("5120bde9b8f2c003300925e314249fea0daade214bbd4ce68c46f8989efc98544495", ref.GetLockingScript().GetHex());
  EXPECT_EQ("91d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0e", ref.GetKeyList()[0].GetSchnorrPubkey().GetHex());
  EXPECT_EQ(tree.ToString(), ref.GetScriptTree().ToString());
  EXPECT_TRUE(ref.GetScriptTree().IsElements());

  ConfidentialTransaction tx1("020000000102f746647f2fd02ecfd3f669184c1f45e12ab9296f763c2d650d3f9ed4f520b0290100000000fffffffff746647f2fd02ecfd3f669184c1f45e12ab9296f763c2d650d3f9ed4f520b0290200000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000017d77c300016001423dc2db292ef54e171839e4a4391d8b45aefcd4b0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000007d000000000000000000140396f2b94c6a81151d07faa26d5f5d7c751b62b1aea59ad7ed9d17fea60ef17e8e2eab28b55796ec0d01b0565c4658b279381674dcce633ee1851125ac762c494000000000000000000");
  ConfidentialAssetId asset("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
  std::vector<ConfidentialTxOut> utxo_list(2);
  utxo_list[0] = ConfidentialTxOut(
    Script("512016f8551db6483d403e9bf3c0b74a5bbafaa20cf0e45ca7e4a35cae924f7a0514"),
    asset, ConfidentialValue(Amount(200000000)));
  utxo_list[1] = ConfidentialTxOut(
    Script("5120e247cebb9d05e3ce87133b3c6cfd15eed31b43f61fe3ceede12594e55966035b"),
    asset, ConfidentialValue(Amount(200000000)));
  BlockHash genesis_block_hash("cc2641af46f536fba45aab6016f63e12a80e4c98bbb2686dafb22b9451cfe338");
  SigHashType sighash_type = SigHashType(SigHashAlgorithm::kSigHashDefault);
  TapScriptData script_data;
  script_data.tap_leaf_hash = tree.GetTapLeafHash();
  script_data.code_separator_position = cfd::core::kDefaultCodeSeparatorPosition;
  auto sighash2 = tx1.GetElementsSchnorrSignatureHash(
    0, sighash_type, genesis_block_hash, utxo_list, &script_data);
  EXPECT_EQ("b69db4132ff6a8e675a8fac89c94652e6331f09115ef3dfcb269842d0adba2cb", sighash2.GetHex());
  auto sig2 = SchnorrUtil::Sign(sighash2, key);
  EXPECT_EQ("4cc7d481c42c342bcbbd39208980895218e94a65581783ce009c0832f98c507edc1e6755047e2155d5b344c8ca496a4ebefd0ec000c782b9c85277dbb264b5b8", sig2.GetHex());
  SchnorrSignature schnorr_sig(sig2);
  schnorr_sig.SetSigHashType(sighash_type);
  tx1.AddScriptWitnessStack(0, schnorr_sig.GetData(true));
  tx1.AddScriptWitnessStack(0, redeem_script.GetData());
  tx1.AddScriptWitnessStack(0, taproot_control);
  EXPECT_EQ("020000000102f746647f2fd02ecfd3f669184c1f45e12ab9296f763c2d650d3f9ed4f520b0290100000000fffffffff746647f2fd02ecfd3f669184c1f45e12ab9296f763c2d650d3f9ed4f520b0290200000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000017d77c300016001423dc2db292ef54e171839e4a4391d8b45aefcd4b0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000007d000000000000000000440396f2b94c6a81151d07faa26d5f5d7c751b62b1aea59ad7ed9d17fea60ef17e8e2eab28b55796ec0d01b0565c4658b279381674dcce633ee1851125ac762c494404cc7d481c42c342bcbbd39208980895218e94a65581783ce009c0832f98c507edc1e6755047e2155d5b344c8ca496a4ebefd0ec000c782b9c85277dbb264b5b8222091d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0eac21c491d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0e000000000000000000", tx1.GetHex());

  EXPECT_TRUE(schnorr_pubkey.Verify(schnorr_sig, sighash2));
}